

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_widgets.cpp
# Opt level: O2

float __thiscall ImGuiMenuColumns::DeclColumns(ImGuiMenuColumns *this,float w0,float w1,float w2)

{
  undefined8 uVar1;
  undefined1 auVar2 [16];
  int i;
  long lVar3;
  undefined1 in_register_00001204 [60];
  undefined1 auVar4 [64];
  undefined1 in_register_00001244 [60];
  undefined1 auVar5 [64];
  undefined1 in_register_00001284 [60];
  undefined1 auVar6 [64];
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  
  auVar6._4_60_ = in_register_00001284;
  auVar6._0_4_ = w2;
  auVar5._4_60_ = in_register_00001244;
  auVar5._0_4_ = w1;
  auVar4._4_60_ = in_register_00001204;
  auVar4._0_4_ = w0;
  auVar7._8_8_ = 0;
  auVar7._0_8_ = *(ulong *)this->NextWidths;
  auVar2 = vinsertps_avx(auVar4._0_16_,auVar5._0_16_,0x10);
  auVar8 = vcmpps_avx(auVar2,auVar7,2);
  auVar8 = vblendvps_avx(auVar2,auVar7,auVar8);
  uVar1 = vmovlps_avx(auVar8);
  *(undefined8 *)this->NextWidths = uVar1;
  auVar8 = vcmpss_avx(auVar6._0_16_,ZEXT416((uint)this->NextWidths[2]),2);
  auVar8 = vblendvps_avx(auVar6._0_16_,ZEXT416((uint)this->NextWidths[2]),auVar8);
  this->NextWidths[2] = auVar8._0_4_;
  auVar4 = ZEXT864(0) << 0x20;
  for (lVar3 = 0; lVar3 != 3; lVar3 = lVar3 + 1) {
    auVar8 = ZEXT816(0) << 0x40;
    if (lVar3 != 0) {
      auVar8 = vcmpss_avx(auVar8,ZEXT416((uint)this->NextWidths[lVar3]),1);
      auVar8 = vandps_avx(auVar8,ZEXT416((uint)this->Spacing));
    }
    auVar4 = ZEXT464((uint)(auVar4._0_4_ + this->NextWidths[lVar3] + auVar8._0_4_));
  }
  this->NextWidth = auVar4._0_4_;
  auVar8 = vcmpss_avx(auVar4._0_16_,ZEXT416((uint)this->Width),2);
  auVar8 = vblendvps_avx(auVar4._0_16_,ZEXT416((uint)this->Width),auVar8);
  return auVar8._0_4_;
}

Assistant:

float ImGuiMenuColumns::DeclColumns(float w0, float w1, float w2) // not using va_arg because they promote float to double
{
    NextWidth = 0.0f;
    NextWidths[0] = ImMax(NextWidths[0], w0);
    NextWidths[1] = ImMax(NextWidths[1], w1);
    NextWidths[2] = ImMax(NextWidths[2], w2);
    for (int i = 0; i < IM_ARRAYSIZE(Pos); i++)
        NextWidth += NextWidths[i] + ((i > 0 && NextWidths[i] > 0.0f) ? Spacing : 0.0f);
    return ImMax(Width, NextWidth);
}